

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O3

int EVP_PBE_scrypt(char *password,size_t password_len,uint8_t *salt,size_t salt_len,uint64_t N,
                  uint64_t r,uint64_t p,size_t max_mem,uint8_t *out_key,size_t key_len)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  uchar *out;
  EVP_MD *pEVar5;
  block_t *__dest;
  block_t *pbVar6;
  uint64_t uVar7;
  uchar *puVar8;
  block_t *pbVar9;
  uint64_t i;
  uint64_t uVar10;
  block_t *out_00;
  ulong __n;
  long lVar11;
  int iVar12;
  uint64_t i_1;
  uint uVar13;
  long lVar14;
  block_t *B;
  uchar *local_88;
  uint local_38;
  
  if (((((p == 0 || r == 0) || (auVar2._8_8_ = 0, auVar2._0_8_ = r, N < 2)) ||
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3fffffff)) / auVar2,0) < p)) ||
      ((0x100000000 < N ||
       (uVar4 = N - (N >> 1 & 0x5555555555555555),
       uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
       1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) ||
     (N >> ((byte)(r << 4) & 0x3f) != 0 && r << 4 < 0x40)) {
    iVar3 = 0x85;
    iVar12 = 0xa1;
  }
  else {
    uVar4 = 0x4100000;
    if (max_mem != 0) {
      uVar4 = max_mem;
    }
    __n = r * 0x80;
    if ((p < uVar4 / __n) && (N <= uVar4 / __n + ~p)) {
      out = (uchar *)OPENSSL_calloc((p * 2 + N * 2 + 2) * r,0x40);
      if (out == (uchar *)0x0) {
        return 0;
      }
      lVar14 = p * 2 * r * 0x40;
      pEVar5 = EVP_sha256();
      iVar12 = (int)lVar14;
      iVar3 = PKCS5_PBKDF2_HMAC(password,(int)password_len,salt,(int)salt_len,1,pEVar5,iVar12,out);
      if (iVar3 == 0) {
        uVar13 = 0;
      }
      else {
        lVar1 = r * 2;
        B = (block_t *)(out + lVar14);
        __dest = B + r * 2;
        uVar7 = 0;
        local_88 = out;
        do {
          out_00 = (block_t *)(out + uVar7 * lVar1 * 0x40);
          memcpy(__dest,out_00,__n);
          uVar10 = 1;
          pbVar9 = (block_t *)(out + (p * 0x80 + 0x100) * r);
          pbVar6 = __dest;
          do {
            scryptBlockMix(pbVar9,pbVar6,r);
            uVar10 = uVar10 + 1;
            pbVar6 = pbVar6 + r * 2;
            pbVar9 = pbVar9 + r * 2;
          } while (N != uVar10);
          scryptBlockMix(out_00,__dest + lVar1 * (N - 1),r);
          uVar10 = 0;
          do {
            if (lVar1 != 0) {
              local_38 = (uint)(N - 1);
              pbVar6 = __dest + (ulong)(out_00[r * 2 + -1].words[0] & local_38) * lVar1;
              lVar14 = 0;
              puVar8 = local_88;
              pbVar9 = B;
              do {
                lVar11 = 0;
                do {
                  pbVar9->words[lVar11] = pbVar6->words[lVar11] ^ *(uint *)(puVar8 + lVar11 * 4);
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x10);
                lVar14 = lVar14 + 1;
                pbVar9 = pbVar9 + 1;
                pbVar6 = pbVar6 + 1;
                puVar8 = puVar8 + 0x40;
              } while (lVar14 != lVar1);
            }
            scryptBlockMix(out_00,B,r);
            uVar10 = uVar10 + 1;
          } while (uVar10 != N);
          uVar7 = uVar7 + 1;
          local_88 = local_88 + __n;
        } while (uVar7 != p);
        pEVar5 = EVP_sha256();
        iVar3 = PKCS5_PBKDF2_HMAC(password,(int)password_len,out,iVar12,1,pEVar5,(int)key_len,
                                  out_key);
        uVar13 = (uint)(iVar3 != 0);
      }
      OPENSSL_free(out);
      return uVar13;
    }
    iVar3 = 0x84;
    iVar12 = 0xad;
  }
  ERR_put_error(6,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,iVar12);
  return 0;
}

Assistant:

int EVP_PBE_scrypt(const char *password, size_t password_len,
                   const uint8_t *salt, size_t salt_len, uint64_t N, uint64_t r,
                   uint64_t p, size_t max_mem, uint8_t *out_key,
                   size_t key_len) {
  if (r == 0 || p == 0 || p > SCRYPT_PR_MAX / r ||
      // |N| must be a power of two.
      N < 2 || (N & (N - 1)) ||
      // We only support |N| <= 2^32 in |scryptROMix|.
      N > UINT64_C(1) << 32 ||
      // Check that |N| < 2^(128×r / 8).
      (16 * r <= 63 && N >= UINT64_C(1) << (16 * r))) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PARAMETERS);
    return 0;
  }

  // Determine the amount of memory needed. B, T, and V are |p|, 1, and |N|
  // scrypt blocks, respectively. Each scrypt block is 2*|r| |block_t|s.
  if (max_mem == 0) {
    max_mem = SCRYPT_MAX_MEM;
  }

  size_t max_scrypt_blocks = max_mem / (2 * r * sizeof(block_t));
  if (max_scrypt_blocks < p + 1 || max_scrypt_blocks - p - 1 < N) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
    return 0;
  }

  // Allocate and divide up the scratch space. |max_mem| fits in a size_t, which
  // is no bigger than uint64_t, so none of these operations may overflow.
  static_assert(UINT64_MAX >= SIZE_MAX, "size_t exceeds uint64_t");
  size_t B_blocks = p * 2 * r;
  size_t B_bytes = B_blocks * sizeof(block_t);
  size_t T_blocks = 2 * r;
  size_t V_blocks = N * 2 * r;
  block_t *B = reinterpret_cast<block_t *>(
      OPENSSL_calloc(B_blocks + T_blocks + V_blocks, sizeof(block_t)));
  if (B == NULL) {
    return 0;
  }

  int ret = 0;
  block_t *T = B + B_blocks;
  block_t *V = T + T_blocks;

  // NOTE: PKCS5_PBKDF2_HMAC can only fail due to allocation failure
  // or |iterations| of 0 (we pass 1 here). This is consistent with
  // the documented failure conditions of EVP_PBE_scrypt.
  if (!PKCS5_PBKDF2_HMAC(password, password_len, salt, salt_len, 1,
                         EVP_sha256(), B_bytes, (uint8_t *)B)) {
    goto err;
  }

  for (uint64_t i = 0; i < p; i++) {
    scryptROMix(B + 2 * r * i, r, N, T, V);
  }

  if (!PKCS5_PBKDF2_HMAC(password, password_len, (const uint8_t *)B, B_bytes, 1,
                         EVP_sha256(), key_len, out_key)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(B);
  return ret;
}